

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O2

PolyNf * __thiscall
Kernel::RenderPolyNf::operator()
          (PolyNf *__return_storage_ptr__,RenderPolyNf *this,
          PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *facs)

{
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> poly;
  RenderMonom local_89;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_88;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_68;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_48;
  
  RenderMonom::operator()(&local_48,&local_89,facs);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_88,&local_48);
  RationalConstantType::~RationalConstantType((RationalConstantType *)&local_48);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&local_68,&local_88);
  operator()(__return_storage_ptr__,this,
             (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_68);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_68);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_88);
  return __return_storage_ptr__;
}

Assistant:

PolyNf operator()(PreMonom<NumTraits> facs) const
  {
    auto poly = Polynom<NumTraits>(RenderMonom{}(std::move(facs)));
    poly.integrity();
    return (*this)(std::move(poly));
  }